

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O0

void __thiscall VMScriptFunction::~VMScriptFunction(VMScriptFunction *this)

{
  int local_14;
  int i;
  VMScriptFunction *this_local;
  
  (this->super_VMFunction).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00b8dbc0;
  if (this->Code != (VMOP *)0x0) {
    if (this->KonstS != (FString *)0x0) {
      for (local_14 = 0; local_14 < (int)(uint)this->NumKonstS; local_14 = local_14 + 1) {
        FString::~FString(this->KonstS + local_14);
      }
    }
    M_Free(this->Code);
  }
  VMFunction::~VMFunction(&this->super_VMFunction);
  return;
}

Assistant:

VMScriptFunction::~VMScriptFunction()
{
	if (Code != NULL)
	{
		if (KonstS != NULL)
		{
			for (int i = 0; i < NumKonstS; ++i)
			{
				KonstS[i].~FString();
			}
		}
		M_Free(Code);
	}
}